

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t FNV32a(void *key,int len,uint32_t seed)

{
  uint uVar1;
  uint32_t h;
  ulong uVar2;
  
  uVar1 = seed ^ 0x811c9dc5;
  if (0 < len) {
    uVar2 = 0;
    do {
      uVar1 = (*(byte *)((long)key + uVar2) ^ uVar1) * 0x1000193;
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  return uVar1;
}

Assistant:

uint32_t
FNV32a(const void *key, int len, uint32_t seed)
{
  uint32_t h = seed;
  const uint8_t  *data = (const uint8_t *)key;

  h ^= UINT32_C(2166136261);
  for (int i = 0; i < len; i++) {
    h ^= data[i];
    h *= 16777619;
  }
  return h;
}